

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O2

Log * Scine::Core::Log::silent(void)

{
  Log *in_RDI;
  undefined1 auVar1 [32];
  
  *(undefined8 *)&(in_RDI->debug).sinks_._M_h._M_rehash_policy = 0;
  (in_RDI->debug).sinks_._M_h._M_buckets = &(in_RDI->debug).sinks_._M_h._M_single_bucket;
  (in_RDI->debug).sinks_._M_h._M_bucket_count = 1;
  (in_RDI->debug).sinks_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (in_RDI->debug).sinks_._M_h._M_element_count = 0;
  (in_RDI->debug).sinks_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  auVar1 = ZEXT1632(ZEXT816(0) << 0x40);
  *(undefined1 (*) [32])&(in_RDI->debug).sinks_._M_h._M_rehash_policy._M_next_resize = auVar1;
  (in_RDI->warning).sinks_._M_h._M_bucket_count = auVar1._0_8_;
  (in_RDI->warning).sinks_._M_h._M_before_begin = (__node_base)auVar1._8_8_;
  (in_RDI->warning).sinks_._M_h._M_element_count = auVar1._16_8_;
  (in_RDI->warning).sinks_._M_h._M_rehash_policy._M_max_load_factor = (float)auVar1._24_4_;
  *(int *)&(in_RDI->warning).sinks_._M_h._M_rehash_policy.field_0x4 = auVar1._28_4_;
  (in_RDI->warning).sinks_._M_h._M_buckets = &(in_RDI->warning).sinks_._M_h._M_single_bucket;
  (in_RDI->warning).sinks_._M_h._M_bucket_count = 1;
  (in_RDI->warning).sinks_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (in_RDI->warning).sinks_._M_h._M_element_count = 0;
  (in_RDI->warning).sinks_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  auVar1 = ZEXT1632(ZEXT816(0) << 0x40);
  *(undefined1 (*) [32])&(in_RDI->warning).sinks_._M_h._M_rehash_policy._M_next_resize = auVar1;
  (in_RDI->error).sinks_._M_h._M_bucket_count = auVar1._0_8_;
  (in_RDI->error).sinks_._M_h._M_before_begin = (__node_base)auVar1._8_8_;
  (in_RDI->error).sinks_._M_h._M_element_count = auVar1._16_8_;
  (in_RDI->error).sinks_._M_h._M_rehash_policy._M_max_load_factor = (float)auVar1._24_4_;
  *(int *)&(in_RDI->error).sinks_._M_h._M_rehash_policy.field_0x4 = auVar1._28_4_;
  (in_RDI->error).sinks_._M_h._M_buckets = &(in_RDI->error).sinks_._M_h._M_single_bucket;
  (in_RDI->error).sinks_._M_h._M_bucket_count = 1;
  (in_RDI->error).sinks_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (in_RDI->error).sinks_._M_h._M_element_count = 0;
  (in_RDI->error).sinks_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [32])&(in_RDI->error).sinks_._M_h._M_rehash_policy._M_next_resize = auVar1;
  (in_RDI->output).sinks_._M_h._M_bucket_count = auVar1._0_8_;
  (in_RDI->output).sinks_._M_h._M_before_begin = (__node_base)auVar1._8_8_;
  (in_RDI->output).sinks_._M_h._M_element_count = auVar1._16_8_;
  (in_RDI->output).sinks_._M_h._M_rehash_policy._M_max_load_factor = (float)auVar1._24_4_;
  *(int *)&(in_RDI->output).sinks_._M_h._M_rehash_policy.field_0x4 = auVar1._28_4_;
  (in_RDI->output).sinks_._M_h._M_buckets = &(in_RDI->output).sinks_._M_h._M_single_bucket;
  (in_RDI->output).sinks_._M_h._M_bucket_count = 1;
  (in_RDI->output).sinks_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (in_RDI->output).sinks_._M_h._M_element_count = 0;
  (in_RDI->output).sinks_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (in_RDI->output).sinks_._M_h._M_rehash_policy._M_next_resize = 0;
  (in_RDI->output).sinks_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return in_RDI;
}

Assistant:

static inline Log silent() {
    return Log{Domain(), Domain(), Domain(), Domain()};
  }